

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O3

CK_RV __thiscall
SoftHSM::AsymVerifyInit
          (SoftHSM *this,CK_SESSION_HANDLE hSession,CK_MECHANISM_PTR pMechanism,
          CK_OBJECT_HANDLE hKey)

{
  CK_MECHANISM_TYPE CVar1;
  long *plVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  Session *this_00;
  Token *pTVar6;
  OSObject *key;
  CK_STATE sessionState;
  CK_RV CVar7;
  CryptoFactory *pCVar8;
  SoftHSM *inAsymmetricCryptoOp;
  DSAPublicKey *publicKey;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  long lVar9;
  undefined4 uVar10;
  undefined8 *inParam;
  SoftHSM *pSVar11;
  Type local_54;
  size_t local_50;
  undefined8 local_48;
  long local_40;
  Token *local_38;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  if (this->isInitialised != true) {
    return 400;
  }
  if (pMechanism == (CK_MECHANISM_PTR)0x0) {
    return 7;
  }
  this_00 = (Session *)HandleManager::getSession(this->handleManager,hSession);
  if (this_00 == (Session *)0x0) {
    return 0xb3;
  }
  iVar4 = Session::getOpType(this_00);
  if (iVar4 != 0) {
    return 0x90;
  }
  pTVar6 = Session::getToken(this_00);
  if (pTVar6 == (Token *)0x0) {
    return 5;
  }
  key = (OSObject *)HandleManager::getObject(this->handleManager,hKey);
  if (key == (OSObject *)0x0) {
    return 0x82;
  }
  iVar4 = (*key->_vptr_OSObject[10])(key);
  if ((char)iVar4 == '\0') {
    return 0x82;
  }
  local_38 = pTVar6;
  iVar4 = (*key->_vptr_OSObject[4])(key,1,0);
  iVar5 = (*key->_vptr_OSObject[4])(key,2,1);
  sessionState = Session::getState(this_00);
  CVar7 = haveRead(sessionState,(CK_BBOOL)iVar4,(CK_BBOOL)iVar5);
  if (CVar7 != 0) {
    if (CVar7 == 0x101) {
      softHSMLog(6,"AsymVerifyInit",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                 ,0x13e3,"User is not authorized");
      return 0x101;
    }
    return CVar7;
  }
  iVar4 = (*key->_vptr_OSObject[4])(key,0x10a,0);
  if ((char)iVar4 == '\0') {
    return 0x68;
  }
  bVar3 = isMechanismPermitted(this,key,pMechanism);
  CVar7 = 0x70;
  if (!bVar3) {
    return 0x70;
  }
  CVar1 = pMechanism->mechanism;
  if ((long)CVar1 < 0x40) {
    bVar3 = false;
    switch(CVar1) {
    case 1:
      local_54 = RSA_PKCS;
      goto LAB_0013680a;
    default:
      goto switchD_001363fe_caseD_2;
    case 3:
      local_54 = RSA;
      inParam = (undefined8 *)0x0;
      local_50 = 0;
      goto LAB_00136574;
    case 5:
      bVar3 = true;
      local_54 = RSA_MD5_PKCS;
      goto LAB_0013680a;
    case 6:
      bVar3 = true;
      local_54 = RSA_SHA1_PKCS;
      goto LAB_0013680a;
    case 0xd:
      plVar2 = (long *)pMechanism->pParameter;
      if ((plVar2 == (long *)0x0) || (pMechanism->ulParameterLen != 0x18)) {
        iVar4 = 0x142e;
        goto LAB_00136a97;
      }
      lVar9 = *plVar2;
      if (lVar9 < 0x255) {
        if (lVar9 == 0x220) {
          local_48._0_4_ = 2;
          lVar9 = 1;
          uVar10 = 1;
        }
        else {
          if (lVar9 != 0x250) {
            return 7;
          }
          local_48._0_4_ = 4;
          lVar9 = 2;
          uVar10 = 3;
        }
      }
      else if (lVar9 == 0x255) {
        local_48._0_4_ = 3;
        lVar9 = 5;
        uVar10 = 2;
      }
      else if (lVar9 == 0x260) {
        local_48._0_4_ = 5;
        lVar9 = 3;
        uVar10 = 4;
      }
      else {
        if (lVar9 != 0x270) {
          return 7;
        }
        local_48._0_4_ = 6;
        lVar9 = 4;
        uVar10 = 5;
      }
      local_48 = CONCAT44(uVar10,(undefined4)local_48);
      if (plVar2[1] != lVar9) {
        return 7;
      }
      local_40 = plVar2[2];
      inParam = &local_48;
      local_50 = 0x10;
      local_54 = RSA_PKCS_PSS;
LAB_00136574:
      bVar3 = false;
      goto LAB_0013680f;
    case 0xe:
      plVar2 = (long *)pMechanism->pParameter;
      if ((((plVar2 == (long *)0x0) || (pMechanism->ulParameterLen != 0x18)) || (*plVar2 != 0x220))
         || (plVar2[1] != 1)) {
        iVar4 = 0x1463;
        goto LAB_00136a97;
      }
      inParam = &local_48;
      local_48 = 0x100000002;
      local_40 = plVar2[2];
      bVar3 = true;
      local_50 = 0x10;
      local_54 = RSA_SHA1_PKCS_PSS;
      goto LAB_0013680f;
    case 0x11:
      local_54 = DSA;
      bVar3 = false;
      break;
    case 0x12:
      local_54 = DSA_SHA1;
      bVar3 = true;
      break;
    case 0x13:
      local_54 = DSA_SHA224;
      bVar3 = true;
      break;
    case 0x14:
      local_54 = DSA_SHA256;
      bVar3 = true;
      break;
    case 0x15:
      local_54 = DSA_SHA384;
      bVar3 = true;
      break;
    case 0x16:
      local_54 = DSA_SHA512;
      bVar3 = true;
    }
    pCVar8 = CryptoFactory::i();
    iVar4 = (*pCVar8->_vptr_CryptoFactory[2])(pCVar8,2);
    inAsymmetricCryptoOp = (SoftHSM *)CONCAT44(extraout_var_01,iVar4);
    if (inAsymmetricCryptoOp != (SoftHSM *)0x0) {
      pSVar11 = inAsymmetricCryptoOp;
      iVar4 = (*inAsymmetricCryptoOp->_vptr_SoftHSM[0x15])();
      publicKey = (DSAPublicKey *)CONCAT44(extraout_var_02,iVar4);
      if (publicKey == (DSAPublicKey *)0x0) goto LAB_001369b1;
      CVar7 = getDSAPublicKey(pSVar11,publicKey,local_38,key);
      if (CVar7 != 0) goto LAB_00136860;
      local_50 = 0;
      inParam = (undefined8 *)0x0;
      goto LAB_0013688c;
    }
    goto LAB_001368da;
  }
  switch(CVar1) {
  case 0x40:
    bVar3 = true;
    local_54 = RSA_SHA256_PKCS;
    goto LAB_0013680a;
  case 0x41:
    bVar3 = true;
    local_54 = RSA_SHA384_PKCS;
    goto LAB_0013680a;
  case 0x42:
    bVar3 = true;
    local_54 = RSA_SHA512_PKCS;
    goto LAB_0013680a;
  case 0x43:
    plVar2 = (long *)pMechanism->pParameter;
    if (((plVar2 == (long *)0x0) || (pMechanism->ulParameterLen != 0x18)) ||
       ((*plVar2 != 0x250 || (plVar2[1] != 2)))) {
      iVar4 = 0x1487;
LAB_00136a97:
      softHSMLog(3,"AsymVerifyInit",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                 ,iVar4,"Invalid parameters");
      return 7;
    }
    inParam = &local_48;
    local_48 = 0x300000004;
    local_40 = plVar2[2];
    bVar3 = true;
    local_50 = 0x10;
    local_54 = RSA_SHA256_PKCS_PSS;
    break;
  case 0x44:
    plVar2 = (long *)pMechanism->pParameter;
    if (((plVar2 == (long *)0x0) || (pMechanism->ulParameterLen != 0x18)) ||
       ((*plVar2 != 0x260 || (plVar2[1] != 3)))) {
      iVar4 = 0x1499;
      goto LAB_00136a97;
    }
    inParam = &local_48;
    local_48 = 0x400000005;
    local_40 = plVar2[2];
    bVar3 = true;
    local_50 = 0x10;
    local_54 = RSA_SHA384_PKCS_PSS;
    break;
  case 0x45:
    plVar2 = (long *)pMechanism->pParameter;
    if ((((plVar2 == (long *)0x0) || (pMechanism->ulParameterLen != 0x18)) || (*plVar2 != 0x270)) ||
       (plVar2[1] != 4)) {
      iVar4 = 0x14ab;
      goto LAB_00136a97;
    }
    inParam = &local_48;
    local_48 = 0x500000006;
    local_40 = plVar2[2];
    bVar3 = true;
    local_50 = 0x10;
    local_54 = RSA_SHA512_PKCS_PSS;
    break;
  case 0x46:
    bVar3 = true;
    local_54 = RSA_SHA224_PKCS;
LAB_0013680a:
    inParam = (undefined8 *)0x0;
    local_50 = 0;
    break;
  case 0x47:
    plVar2 = (long *)pMechanism->pParameter;
    if (((plVar2 == (long *)0x0) || (pMechanism->ulParameterLen != 0x18)) ||
       ((*plVar2 != 0x255 || (plVar2[1] != 5)))) {
      iVar4 = 0x1475;
      goto LAB_00136a97;
    }
    inParam = &local_48;
    local_48 = 0x200000003;
    local_40 = plVar2[2];
    bVar3 = true;
    local_50 = 0x10;
    local_54 = RSA_SHA224_PKCS_PSS;
    break;
  default:
    if (CVar1 == 0x1041) {
      pCVar8 = CryptoFactory::i();
      iVar4 = (*pCVar8->_vptr_CryptoFactory[2])(pCVar8,5);
      inAsymmetricCryptoOp = (SoftHSM *)CONCAT44(extraout_var_05,iVar4);
      if (inAsymmetricCryptoOp == (SoftHSM *)0x0) {
        return 0x70;
      }
      pSVar11 = inAsymmetricCryptoOp;
      iVar4 = (*inAsymmetricCryptoOp->_vptr_SoftHSM[0x15])();
      publicKey = (DSAPublicKey *)CONCAT44(extraout_var_06,iVar4);
      if (publicKey == (DSAPublicKey *)0x0) goto LAB_001369b1;
      CVar7 = getECPublicKey(pSVar11,(ECPublicKey *)publicKey,local_38,key);
      if (CVar7 != 0) goto LAB_00136860;
      local_54 = ECDSA;
    }
    else {
      if (CVar1 != 0x1057) {
        return 0x70;
      }
      pCVar8 = CryptoFactory::i();
      iVar4 = (*pCVar8->_vptr_CryptoFactory[2])(pCVar8,7);
      inAsymmetricCryptoOp = (SoftHSM *)CONCAT44(extraout_var,iVar4);
      if (inAsymmetricCryptoOp == (SoftHSM *)0x0) {
        return 0x70;
      }
      pSVar11 = inAsymmetricCryptoOp;
      iVar4 = (*inAsymmetricCryptoOp->_vptr_SoftHSM[0x15])();
      publicKey = (DSAPublicKey *)CONCAT44(extraout_var_00,iVar4);
      if (publicKey == (DSAPublicKey *)0x0) goto LAB_001369b1;
      CVar7 = getEDPublicKey(pSVar11,(EDPublicKey *)publicKey,local_38,key);
      if (CVar7 != 0) goto LAB_00136860;
      local_54 = EDDSA;
    }
    inParam = (undefined8 *)0x0;
    local_50 = 0;
    goto LAB_0013694e;
  }
LAB_0013680f:
  pCVar8 = CryptoFactory::i();
  iVar4 = (*pCVar8->_vptr_CryptoFactory[2])(pCVar8,1);
  inAsymmetricCryptoOp = (SoftHSM *)CONCAT44(extraout_var_03,iVar4);
  if (inAsymmetricCryptoOp == (SoftHSM *)0x0) {
LAB_001368da:
    CVar7 = 0x70;
  }
  else {
    pSVar11 = inAsymmetricCryptoOp;
    iVar4 = (*inAsymmetricCryptoOp->_vptr_SoftHSM[0x15])();
    publicKey = (DSAPublicKey *)CONCAT44(extraout_var_04,iVar4);
    if (publicKey == (DSAPublicKey *)0x0) {
LAB_001369b1:
      pCVar8 = CryptoFactory::i();
      (*pCVar8->_vptr_CryptoFactory[3])(pCVar8,inAsymmetricCryptoOp);
      return 2;
    }
    CVar7 = getRSAPublicKey(pSVar11,(RSAPublicKey *)publicKey,local_38,key);
    if (CVar7 != 0) {
LAB_00136860:
      (*inAsymmetricCryptoOp->_vptr_SoftHSM[0x1a])(inAsymmetricCryptoOp,publicKey);
      pCVar8 = CryptoFactory::i();
      (*pCVar8->_vptr_CryptoFactory[3])(pCVar8,inAsymmetricCryptoOp);
      return 5;
    }
LAB_0013688c:
    if (bVar3) {
      iVar4 = (*inAsymmetricCryptoOp->_vptr_SoftHSM[7])
                        (inAsymmetricCryptoOp,publicKey,(ulong)local_54,inParam,local_50);
      bVar3 = true;
      if ((char)iVar4 == '\0') {
        (*inAsymmetricCryptoOp->_vptr_SoftHSM[0x1a])(inAsymmetricCryptoOp,publicKey);
        pCVar8 = CryptoFactory::i();
        (*pCVar8->_vptr_CryptoFactory[3])(pCVar8,inAsymmetricCryptoOp);
        goto LAB_001368da;
      }
    }
    else {
LAB_0013694e:
      bVar3 = false;
    }
    Session::setOpType(this_00,6);
    Session::setAsymmetricCryptoOp(this_00,(AsymmetricAlgorithm *)inAsymmetricCryptoOp);
    Session::setMechanism(this_00,local_54);
    Session::setParameters(this_00,inParam,local_50);
    Session::setAllowMultiPartOp(this_00,bVar3);
    Session::setAllowSinglePartOp(this_00,true);
    Session::setPublicKey(this_00,&publicKey->super_PublicKey);
    CVar7 = 0;
  }
switchD_001363fe_caseD_2:
  return CVar7;
}

Assistant:

CK_RV SoftHSM::AsymVerifyInit(CK_SESSION_HANDLE hSession, CK_MECHANISM_PTR pMechanism, CK_OBJECT_HANDLE hKey)
{
	if (!isInitialised) return CKR_CRYPTOKI_NOT_INITIALIZED;

	if (pMechanism == NULL_PTR) return CKR_ARGUMENTS_BAD;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL) return CKR_SESSION_HANDLE_INVALID;

	// Check if we have another operation
	if (session->getOpType() != SESSION_OP_NONE) return CKR_OPERATION_ACTIVE;

	// Get the token
	Token* token = session->getToken();
	if (token == NULL) return CKR_GENERAL_ERROR;

	// Check the key handle.
	OSObject *key = (OSObject *)handleManager->getObject(hKey);
	if (key == NULL_PTR || !key->isValid()) return CKR_OBJECT_HANDLE_INVALID;

	CK_BBOOL isOnToken = key->getBooleanValue(CKA_TOKEN, false);
	CK_BBOOL isPrivate = key->getBooleanValue(CKA_PRIVATE, true);

	// Check read user credentials
	CK_RV rv = haveRead(session->getState(), isOnToken, isPrivate);
	if (rv != CKR_OK)
	{
		if (rv == CKR_USER_NOT_LOGGED_IN)
			INFO_MSG("User is not authorized");

		return rv;
	}

	// Check if key can be used for verifying
	if (!key->getBooleanValue(CKA_VERIFY, false))
		return CKR_KEY_FUNCTION_NOT_PERMITTED;

	// Check if the specified mechanism is allowed for the key
	if (!isMechanismPermitted(key, pMechanism))
		return CKR_MECHANISM_INVALID;

	// Get the asymmetric algorithm matching the mechanism
	AsymMech::Type mechanism = AsymMech::Unknown;
	void* param = NULL;
	size_t paramLen = 0;
	RSA_PKCS_PSS_PARAMS pssParam;
	bool bAllowMultiPartOp;
	bool isRSA = false;
	bool isDSA = false;
#ifdef WITH_ECC
	bool isECDSA = false;
#endif
#ifdef WITH_EDDSA
	bool isEDDSA = false;
#endif
	switch(pMechanism->mechanism) {
		case CKM_RSA_PKCS:
			mechanism = AsymMech::RSA_PKCS;
			bAllowMultiPartOp = false;
			isRSA = true;
			break;
		case CKM_RSA_X_509:
			mechanism = AsymMech::RSA;
			bAllowMultiPartOp = false;
			isRSA = true;
			break;
#ifndef WITH_FIPS
		case CKM_MD5_RSA_PKCS:
			mechanism = AsymMech::RSA_MD5_PKCS;
			bAllowMultiPartOp = true;
			isRSA = true;
			break;
#endif
		case CKM_SHA1_RSA_PKCS:
			mechanism = AsymMech::RSA_SHA1_PKCS;
			bAllowMultiPartOp = true;
			isRSA = true;
			break;
		case CKM_SHA224_RSA_PKCS:
			mechanism = AsymMech::RSA_SHA224_PKCS;
			bAllowMultiPartOp = true;
			isRSA = true;
			break;
		case CKM_SHA256_RSA_PKCS:
			mechanism = AsymMech::RSA_SHA256_PKCS;
			bAllowMultiPartOp = true;
			isRSA = true;
			break;
		case CKM_SHA384_RSA_PKCS:
			mechanism = AsymMech::RSA_SHA384_PKCS;
			bAllowMultiPartOp = true;
			isRSA = true;
			break;
		case CKM_SHA512_RSA_PKCS:
			mechanism = AsymMech::RSA_SHA512_PKCS;
			bAllowMultiPartOp = true;
			isRSA = true;
			break;
#ifdef WITH_RAW_PSS
		case CKM_RSA_PKCS_PSS:
			if (pMechanism->pParameter == NULL_PTR ||
			    pMechanism->ulParameterLen != sizeof(CK_RSA_PKCS_PSS_PARAMS))
			{
				ERROR_MSG("Invalid parameters");
				return CKR_ARGUMENTS_BAD;
			}
			mechanism = AsymMech::RSA_PKCS_PSS;

			unsigned long expectedMgf;
			switch(CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->hashAlg) {
				case CKM_SHA_1:
					pssParam.hashAlg = HashAlgo::SHA1;
					pssParam.mgf = AsymRSAMGF::MGF1_SHA1;
					expectedMgf = CKG_MGF1_SHA1;
					break;
				case CKM_SHA224:
					pssParam.hashAlg = HashAlgo::SHA224;
					pssParam.mgf = AsymRSAMGF::MGF1_SHA224;
					expectedMgf = CKG_MGF1_SHA224;
					break;
				case CKM_SHA256:
					pssParam.hashAlg = HashAlgo::SHA256;
					pssParam.mgf = AsymRSAMGF::MGF1_SHA256;
					expectedMgf = CKG_MGF1_SHA256;
					break;
				case CKM_SHA384:
					pssParam.hashAlg = HashAlgo::SHA384;
					pssParam.mgf = AsymRSAMGF::MGF1_SHA384;
					expectedMgf = CKG_MGF1_SHA384;
					break;
				case CKM_SHA512:
					pssParam.hashAlg = HashAlgo::SHA512;
					pssParam.mgf = AsymRSAMGF::MGF1_SHA512;
					expectedMgf = CKG_MGF1_SHA512;
					break;
				default:
					return CKR_ARGUMENTS_BAD;
			}

			if (CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->mgf != expectedMgf) {
				return CKR_ARGUMENTS_BAD;
			}

			pssParam.sLen = CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->sLen;
			param = &pssParam;
			paramLen = sizeof(pssParam);
			bAllowMultiPartOp = false;
			isRSA = true;
			break;
#endif
		case CKM_SHA1_RSA_PKCS_PSS:
			if (pMechanism->pParameter == NULL_PTR ||
			    pMechanism->ulParameterLen != sizeof(CK_RSA_PKCS_PSS_PARAMS) ||
			    CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->hashAlg != CKM_SHA_1 ||
			    CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->mgf != CKG_MGF1_SHA1)
			{
				ERROR_MSG("Invalid parameters");
				return CKR_ARGUMENTS_BAD;
			}
			mechanism = AsymMech::RSA_SHA1_PKCS_PSS;
			pssParam.hashAlg = HashAlgo::SHA1;
			pssParam.mgf = AsymRSAMGF::MGF1_SHA1;
			pssParam.sLen = CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->sLen;
			param = &pssParam;
			paramLen = sizeof(pssParam);
			bAllowMultiPartOp = true;
			isRSA = true;
			break;
		case CKM_SHA224_RSA_PKCS_PSS:
			if (pMechanism->pParameter == NULL_PTR ||
			    pMechanism->ulParameterLen != sizeof(CK_RSA_PKCS_PSS_PARAMS) ||
			    CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->hashAlg != CKM_SHA224 ||
			    CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->mgf != CKG_MGF1_SHA224)
			{
				ERROR_MSG("Invalid parameters");
				return CKR_ARGUMENTS_BAD;
			}
			mechanism = AsymMech::RSA_SHA224_PKCS_PSS;
			pssParam.hashAlg = HashAlgo::SHA224;
			pssParam.mgf = AsymRSAMGF::MGF1_SHA224;
			pssParam.sLen = CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->sLen;
			param = &pssParam;
			paramLen = sizeof(pssParam);
			bAllowMultiPartOp = true;
			isRSA = true;
			break;
		case CKM_SHA256_RSA_PKCS_PSS:
			if (pMechanism->pParameter == NULL_PTR ||
			    pMechanism->ulParameterLen != sizeof(CK_RSA_PKCS_PSS_PARAMS) ||
			    CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->hashAlg != CKM_SHA256 ||
			    CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->mgf != CKG_MGF1_SHA256)
			{
				ERROR_MSG("Invalid parameters");
				return CKR_ARGUMENTS_BAD;
			}
			mechanism = AsymMech::RSA_SHA256_PKCS_PSS;
			pssParam.hashAlg = HashAlgo::SHA256;
			pssParam.mgf = AsymRSAMGF::MGF1_SHA256;
			pssParam.sLen = CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->sLen;
			param = &pssParam;
			paramLen = sizeof(pssParam);
			bAllowMultiPartOp = true;
			isRSA = true;
			break;
		case CKM_SHA384_RSA_PKCS_PSS:
			if (pMechanism->pParameter == NULL_PTR ||
			    pMechanism->ulParameterLen != sizeof(CK_RSA_PKCS_PSS_PARAMS) ||
			    CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->hashAlg != CKM_SHA384 ||
			    CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->mgf != CKG_MGF1_SHA384)
			{
				ERROR_MSG("Invalid parameters");
				return CKR_ARGUMENTS_BAD;
			}
			mechanism = AsymMech::RSA_SHA384_PKCS_PSS;
			pssParam.hashAlg = HashAlgo::SHA384;
			pssParam.mgf = AsymRSAMGF::MGF1_SHA384;
			pssParam.sLen = CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->sLen;
			param = &pssParam;
			paramLen = sizeof(pssParam);
			bAllowMultiPartOp = true;
			isRSA = true;
			break;
		case CKM_SHA512_RSA_PKCS_PSS:
			if (pMechanism->pParameter == NULL_PTR ||
			    pMechanism->ulParameterLen != sizeof(CK_RSA_PKCS_PSS_PARAMS) ||
			    CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->hashAlg != CKM_SHA512 ||
			    CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->mgf != CKG_MGF1_SHA512)
			{
				ERROR_MSG("Invalid parameters");
				return CKR_ARGUMENTS_BAD;
			}
			mechanism = AsymMech::RSA_SHA512_PKCS_PSS;
			pssParam.hashAlg = HashAlgo::SHA512;
			pssParam.mgf = AsymRSAMGF::MGF1_SHA512;
			pssParam.sLen = CK_RSA_PKCS_PSS_PARAMS_PTR(pMechanism->pParameter)->sLen;
			param = &pssParam;
			paramLen = sizeof(pssParam);
			bAllowMultiPartOp = true;
			isRSA = true;
			break;
		case CKM_DSA:
			mechanism = AsymMech::DSA;
			bAllowMultiPartOp = false;
			isDSA = true;
			break;
		case CKM_DSA_SHA1:
			mechanism = AsymMech::DSA_SHA1;
			bAllowMultiPartOp = true;
			isDSA = true;
			break;
		case CKM_DSA_SHA224:
			mechanism = AsymMech::DSA_SHA224;
			bAllowMultiPartOp = true;
			isDSA = true;
			break;
		case CKM_DSA_SHA256:
			mechanism = AsymMech::DSA_SHA256;
			bAllowMultiPartOp = true;
			isDSA = true;
			break;
		case CKM_DSA_SHA384:
			mechanism = AsymMech::DSA_SHA384;
			bAllowMultiPartOp = true;
			isDSA = true;
			break;
		case CKM_DSA_SHA512:
			mechanism = AsymMech::DSA_SHA512;
			bAllowMultiPartOp = true;
			isDSA = true;
			break;
#ifdef WITH_ECC
		case CKM_ECDSA:
			mechanism = AsymMech::ECDSA;
			bAllowMultiPartOp = false;
			isECDSA = true;
			break;
#endif
#ifdef WITH_GOST
		case CKM_GOSTR3410:
			mechanism = AsymMech::GOST;
			bAllowMultiPartOp = false;
			break;
		case CKM_GOSTR3410_WITH_GOSTR3411:
			mechanism = AsymMech::GOST_GOST;
			bAllowMultiPartOp = true;
			break;
#endif
#ifdef WITH_EDDSA
		case CKM_EDDSA:
			mechanism = AsymMech::EDDSA;
			bAllowMultiPartOp = false;
			isEDDSA = true;
			break;
#endif
		default:
			return CKR_MECHANISM_INVALID;
	}

	AsymmetricAlgorithm* asymCrypto = NULL;
	PublicKey* publicKey = NULL;
	if (isRSA)
	{
		asymCrypto = CryptoFactory::i()->getAsymmetricAlgorithm(AsymAlgo::RSA);
		if (asymCrypto == NULL) return CKR_MECHANISM_INVALID;

		publicKey = asymCrypto->newPublicKey();
		if (publicKey == NULL)
		{
			CryptoFactory::i()->recycleAsymmetricAlgorithm(asymCrypto);
			return CKR_HOST_MEMORY;
		}

		if (getRSAPublicKey((RSAPublicKey*)publicKey, token, key) != CKR_OK)
		{
			asymCrypto->recyclePublicKey(publicKey);
			CryptoFactory::i()->recycleAsymmetricAlgorithm(asymCrypto);
			return CKR_GENERAL_ERROR;
		}
	}
	else if (isDSA)
	{
		asymCrypto = CryptoFactory::i()->getAsymmetricAlgorithm(AsymAlgo::DSA);
		if (asymCrypto == NULL) return CKR_MECHANISM_INVALID;

		publicKey = asymCrypto->newPublicKey();
		if (publicKey == NULL)
		{
			CryptoFactory::i()->recycleAsymmetricAlgorithm(asymCrypto);
			return CKR_HOST_MEMORY;
		}

		if (getDSAPublicKey((DSAPublicKey*)publicKey, token, key) != CKR_OK)
		{
			asymCrypto->recyclePublicKey(publicKey);
			CryptoFactory::i()->recycleAsymmetricAlgorithm(asymCrypto);
			return CKR_GENERAL_ERROR;
		}
        }
#ifdef WITH_ECC
	else if (isECDSA)
	{
		asymCrypto = CryptoFactory::i()->getAsymmetricAlgorithm(AsymAlgo::ECDSA);
		if (asymCrypto == NULL) return CKR_MECHANISM_INVALID;

		publicKey = asymCrypto->newPublicKey();
		if (publicKey == NULL)
		{
			CryptoFactory::i()->recycleAsymmetricAlgorithm(asymCrypto);
			return CKR_HOST_MEMORY;
		}

		if (getECPublicKey((ECPublicKey*)publicKey, token, key) != CKR_OK)
		{
			asymCrypto->recyclePublicKey(publicKey);
			CryptoFactory::i()->recycleAsymmetricAlgorithm(asymCrypto);
			return CKR_GENERAL_ERROR;
		}
	}
#endif
#ifdef WITH_EDDSA
	else if (isEDDSA)
	{
		asymCrypto = CryptoFactory::i()->getAsymmetricAlgorithm(AsymAlgo::EDDSA);
		if (asymCrypto == NULL) return CKR_MECHANISM_INVALID;

		publicKey = asymCrypto->newPublicKey();
		if (publicKey == NULL)
		{
			CryptoFactory::i()->recycleAsymmetricAlgorithm(asymCrypto);
			return CKR_HOST_MEMORY;
		}

		if (getEDPublicKey((EDPublicKey*)publicKey, token, key) != CKR_OK)
		{
			asymCrypto->recyclePublicKey(publicKey);
			CryptoFactory::i()->recycleAsymmetricAlgorithm(asymCrypto);
			return CKR_GENERAL_ERROR;
		}
	}
#endif
	else
	{
#ifdef WITH_GOST
		asymCrypto = CryptoFactory::i()->getAsymmetricAlgorithm(AsymAlgo::GOST);
		if (asymCrypto == NULL) return CKR_MECHANISM_INVALID;

		publicKey = asymCrypto->newPublicKey();
		if (publicKey == NULL)
		{
			CryptoFactory::i()->recycleAsymmetricAlgorithm(asymCrypto);
			return CKR_HOST_MEMORY;
		}

		if (getGOSTPublicKey((GOSTPublicKey*)publicKey, token, key) != CKR_OK)
		{
			asymCrypto->recyclePublicKey(publicKey);
			CryptoFactory::i()->recycleAsymmetricAlgorithm(asymCrypto);
			return CKR_GENERAL_ERROR;
		}
#else
		return CKR_MECHANISM_INVALID;
#endif
        }